

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void Cmd_addplayerclass(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  PClassActor *ti_00;
  char *pcVar4;
  int local_4c;
  undefined1 auStack_48 [4];
  int arg;
  FPlayerClass newclass;
  PClassActor *ti;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if ((ParsingKeyConf) && (iVar2 = FCommandLine::argc(argv), 1 < iVar2)) {
    pcVar3 = FCommandLine::operator[](argv,1);
    ti_00 = PClass::FindActor(pcVar3);
    newclass.Skins._8_8_ = ti_00;
    pcVar3 = FCommandLine::operator[](argv,1);
    bVar1 = ValidatePlayerClass(ti_00,pcVar3);
    if (bVar1) {
      FPlayerClass::FPlayerClass((FPlayerClass *)auStack_48);
      _auStack_48 = (PClassPlayerPawn *)newclass.Skins._8_8_;
      newclass.Type._0_4_ = 0;
      for (local_4c = 2; iVar2 = FCommandLine::argc(argv), local_4c < iVar2; local_4c = local_4c + 1
          ) {
        pcVar3 = FCommandLine::operator[](argv,local_4c);
        iVar2 = strcasecmp(pcVar3,"nomenu");
        if (iVar2 == 0) {
          newclass.Type._0_4_ = (uint)newclass.Type | 1;
        }
        else {
          pcVar3 = FCommandLine::operator[](argv,local_4c);
          pcVar4 = FCommandLine::operator[](argv,1);
          Printf("Unknown flag \'%s\' for player class \'%s\'\n",pcVar3,pcVar4);
        }
      }
      TArray<FPlayerClass,_FPlayerClass>::Push(&PlayerClasses,(FPlayerClass *)auStack_48);
      FPlayerClass::~FPlayerClass((FPlayerClass *)auStack_48);
    }
  }
  return;
}

Assistant:

CCMD (addplayerclass)
{
	if (ParsingKeyConf && argv.argc () > 1)
	{
		PClassActor *ti = PClass::FindActor(argv[1]);

		if (ValidatePlayerClass(ti, argv[1]))
		{
			FPlayerClass newclass;

			newclass.Type = static_cast<PClassPlayerPawn *>(ti);
			newclass.Flags = 0;

			int arg = 2;
			while (arg < argv.argc())
			{
				if (!stricmp (argv[arg], "nomenu"))
				{
					newclass.Flags |= PCF_NOMENU;
				}
				else
				{
					Printf ("Unknown flag '%s' for player class '%s'\n", argv[arg], argv[1]);
				}

				arg++;
			}
			PlayerClasses.Push (newclass);
		}
	}
}